

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosCommMPI.cpp
# Opt level: O2

CommImplMPI * __thiscall
adios2::helper::CommImplMPI::Irecv
          (CommImplMPI *this,void *buffer,size_t count,Datatype datatype,int source,int tag,
          string *hint)

{
  vector<ompi_request_t*,std::allocator<ompi_request_t*>> *this_00;
  long lVar1;
  int iVar2;
  long *plVar3;
  undefined4 in_register_0000000c;
  ulong uVar4;
  unsigned_long __val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  ulong local_c0;
  CommImplMPI *local_b8;
  long local_b0;
  ulong local_a8;
  size_t local_a0;
  MPI_Request mpiReq;
  MPI_Request mpiReq_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  uVar4 = CONCAT44(in_register_0000000c,datatype);
  plVar3 = (long *)operator_new(0x28);
  lVar1 = *(long *)((anonymous_namespace)::DatatypeToMPI + (long)source * 8);
  *plVar3 = (long)&PTR__CommReqImplMPI_0016e6a0;
  plVar3[1] = lVar1;
  this_00 = (vector<ompi_request_t*,std::allocator<ompi_request_t*>> *)(plVar3 + 2);
  plVar3[2] = 0;
  plVar3[3] = 0;
  plVar3[4] = 0;
  if (uVar4 < 0x7ffe7001) {
    iVar2 = MPI_Irecv(count,datatype,lVar1,tag,(ulong)hint & 0xffffffff,
                      *(undefined8 *)((long)buffer + 8),&mpiReq_1);
    std::operator+(&local_100," in call to Isend with single batch ",in_stack_00000010);
    std::operator+(&local_e0,&local_100,"\n");
    anon_unknown_1::CheckMPIReturn(iVar2,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    std::vector<ompi_request_t*,std::allocator<ompi_request_t*>>::emplace_back<ompi_request_t*&>
              (this_00,&mpiReq_1);
  }
  else {
    local_a8 = uVar4 / 0x7ffe7000;
    local_c0 = uVar4 % 0x7ffe7000;
    local_b8 = this;
    local_b0 = lVar1;
    for (__val = 0; this = local_b8, local_a8 != __val; __val = __val + 1) {
      local_a0 = count;
      iVar2 = MPI_Irecv(count,0x7ffe7000,local_b0,tag,(ulong)hint & 0xffffffff,
                        *(undefined8 *)((long)buffer + 8),&mpiReq);
      std::__cxx11::to_string(&local_50,__val);
      std::operator+(&local_70,"in call to Irecv batch ",&local_50);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mpiReq_1,
                     &local_70," ");
      std::operator+(&local_100,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mpiReq_1,
                     in_stack_00000010);
      std::operator+(&local_e0,&local_100,"\n");
      anon_unknown_1::CheckMPIReturn(iVar2,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&mpiReq_1);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      std::vector<ompi_request_t*,std::allocator<ompi_request_t*>>::emplace_back<ompi_request_t*&>
                (this_00,&mpiReq);
      count = local_a0 + 0x7ffe7000;
    }
    if (local_c0 != 0) {
      iVar2 = MPI_Irecv(count,local_c0,local_b0,tag,(ulong)hint & 0xffffffff,
                        *(undefined8 *)((long)buffer + 8),&mpiReq_1);
      std::operator+(&local_100,"in call to Irecv remainder batch ",in_stack_00000010);
      std::operator+(&local_e0,&local_100,"\n");
      anon_unknown_1::CheckMPIReturn(iVar2,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::vector<ompi_request_t*,std::allocator<ompi_request_t*>>::emplace_back<ompi_request_t*&>
                (this_00,&mpiReq_1);
    }
  }
  adios2::helper::CommImpl::MakeReq(this);
  if (plVar3 != (long *)0x0) {
    (**(code **)(*plVar3 + 8))();
  }
  return this;
}

Assistant:

Comm::Req CommImplMPI::Irecv(void *buffer, size_t count, Datatype datatype, int source, int tag,
                             const std::string &hint) const
{
    auto req = std::unique_ptr<CommReqImplMPI>(new CommReqImplMPI(ToMPI(datatype)));

    if (count > DefaultMaxFileBatchSize)
    {
        const size_t batches = count / DefaultMaxFileBatchSize;
        size_t position = 0;
        for (size_t b = 0; b < batches; ++b)
        {
            int batchSize = static_cast<int>(DefaultMaxFileBatchSize);
            MPI_Request mpiReq;
            CheckMPIReturn(MPI_Irecv(static_cast<char *>(buffer) + position, batchSize,
                                     ToMPI(datatype), source, tag, m_MPIComm, &mpiReq),
                           "in call to Irecv batch " + std::to_string(b) + " " + hint + "\n");
            req->m_MPIReqs.emplace_back(mpiReq);

            position += DefaultMaxFileBatchSize;
        }

        const size_t remainder = count % DefaultMaxFileBatchSize;
        if (remainder > 0)
        {
            int batchSize = static_cast<int>(remainder);
            MPI_Request mpiReq;
            CheckMPIReturn(MPI_Irecv(static_cast<char *>(buffer) + position, batchSize,
                                     ToMPI(datatype), source, tag, m_MPIComm, &mpiReq),
                           "in call to Irecv remainder batch " + hint + "\n");
            req->m_MPIReqs.emplace_back(mpiReq);
        }
    }
    else
    {
        int batchSize = static_cast<int>(count);
        MPI_Request mpiReq;
        CheckMPIReturn(
            MPI_Irecv(buffer, batchSize, ToMPI(datatype), source, tag, m_MPIComm, &mpiReq),
            " in call to Isend with single batch " + hint + "\n");
        req->m_MPIReqs.emplace_back(mpiReq);
    }

    return MakeReq(std::move(req));
}